

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_n_binary_ops_template_signed.h
# Opt level: O3

bool __thiscall
test_uintwide_t_n_binary_ops_template_signed<64U,_unsigned_short,_void>::test_binary_shr
          (test_uintwide_t_n_binary_ops_template_signed<64U,_unsigned_short,_void> *this)

{
  anon_class_32_4_006e9c57 parallel_function;
  uint uVar1;
  random_generator_type *prVar2;
  size_t __i;
  long lVar3;
  atomic_flag test_lock;
  bool result_is_ok;
  undefined6 in_stack_ffffffffffffffd0;
  undefined1 uVar4;
  
  prVar2 = test_uintwide_t_n_binary_ops_base::my_gen();
  uVar1 = util::util_pseudorandom_time_point_seed::value<unsigned_int>();
  prVar2->_M_x[0] = uVar1;
  lVar3 = 1;
  do {
    uVar1 = (uVar1 >> 0x1e ^ uVar1) * 0x6c078965 + (int)lVar3;
    prVar2->_M_x[lVar3] = uVar1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x270);
  prVar2->_M_p = 0x270;
  uVar4 = 1;
  parallel_function.u_boost =
       (number<boost::multiprecision::backends::cpp_int_backend<24U,_24U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>
        **)&stack0xffffffffffffffd7;
  parallel_function.u_local =
       (uintwide_t<24U,_unsigned_char,_void,_false> **)&stack0xffffffffffffffd6;
  parallel_function.distribution = (distribution_type *)this;
  parallel_function.rnd_lock._0_6_ = in_stack_ffffffffffffffd0;
  parallel_function.rnd_lock._6_1_ = 0;
  parallel_function.rnd_lock._7_1_ = 1;
  my_concurrency::
  parallel_for<unsigned_long,test_uintwide_t_n_binary_ops_template_signed<64u,unsigned_short,void>::test_binary_shr()const::_lambda(unsigned_long)_1_>
            (0,(this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
               number_of_cases,parallel_function);
  return (bool)uVar4;
}

Assistant:

WIDE_INTEGER_NODISCARD virtual auto test_binary_shr() const -> bool
    {
      my_gen().seed(util::util_pseudorandom_time_point_seed::value<typename random_generator_type::result_type>());

      bool result_is_ok = true;

      std::atomic_flag test_lock = ATOMIC_FLAG_INIT;

      my_concurrency::parallel_for
      (
        static_cast<std::size_t>(0U),
        size(),
        [&test_lock, &result_is_ok, this](std::size_t i)
        {
          while(test_lock.test_and_set()) { ; }
          const auto u_shr = static_cast<std::uint32_t>(my_distrib_0_to_63(my_eng));
          test_lock.clear();

          const native_sint_type c_native_signed = a_native_signed[i] >> u_shr; // NOLINT(hicpp-signed-bitwise)
          const local_sint_type  c_local_signed  = a_local_signed [i] >> u_shr;

          const bool current_result_is_zero = (c_local_signed == 0U);
          const bool current_result_is_ok   = (current_result_is_zero || (c_native_signed == static_cast<std::int64_t>(c_local_signed)));

          while(test_lock.test_and_set()) { ; }
          result_is_ok = (current_result_is_ok && result_is_ok);
          test_lock.clear();
        }
      );

      return result_is_ok;
    }